

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.hpp
# Opt level: O2

pair<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
* __thiscall
jessilib::
word_split_once<std::__cxx11::basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>,__gnu_cxx::__normal_iterator<signed_char_const*,std::__cxx11::basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>>,__gnu_cxx::__normal_iterator<signed_char_const*,std::__cxx11::basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>>,signed_char>
          (pair<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
           *__return_storage_ptr__,jessilib *this,
          __normal_iterator<const_signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
          begin,__normal_iterator<const_signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
                end,char in_whitespace)

{
  jessilib jVar1;
  __normal_iterator<const_signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
  _Var2;
  pair<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
  *this_00;
  __normal_iterator<const_signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
  in_end;
  pair<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
  result;
  basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_> local_90;
  pair<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
  local_70;
  
  jVar1 = SUB81(end._M_current,0);
  local_70.first._M_dataplus._M_p = (pointer)&local_70.first.field_2;
  local_70.first._M_string_length = 0;
  local_70.first.field_2._M_local_buf[0] = '\0';
  local_70.second._M_dataplus._M_p = (pointer)&local_70.second.field_2;
  local_70.second._M_string_length = 0;
  local_70.second.field_2._M_local_buf[0] = '\0';
  if (begin._M_current <= this) goto LAB_0033ddd0;
  this_00 = (pair<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
             *)&local_70.second;
  for (; (in_end._M_current = begin._M_current, _Var2._M_current = begin._M_current,
         this != (jessilib *)begin._M_current &&
         (in_end._M_current = (char *)this, _Var2._M_current = (char *)this, *this == jVar1));
      this = this + 1) {
  }
  for (; in_end._M_current != begin._M_current; in_end._M_current = in_end._M_current + 1) {
    if ((jessilib)*in_end._M_current == jVar1) {
      make_word_split_member<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,___gnu_cxx::__normal_iterator<const_signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<const_signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>,_nullptr>
                (&local_90,_Var2,in_end);
      std::__cxx11::
      basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>::
      operator=(&local_70.first,&local_90);
      std::__cxx11::
      basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>::
      ~basic_string(&local_90);
      goto LAB_0033dd90;
    }
  }
  make_word_split_member<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,___gnu_cxx::__normal_iterator<const_signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<const_signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>,_nullptr>
            (&local_90,_Var2,begin);
  this_00 = &local_70;
  goto LAB_0033ddc0;
  while (_Var2._M_current = in_end._M_current, (jessilib)*in_end._M_current == jVar1) {
LAB_0033dd90:
    in_end._M_current = in_end._M_current + 1;
    _Var2._M_current = begin._M_current;
    if (in_end._M_current == begin._M_current) break;
  }
  make_word_split_member<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,___gnu_cxx::__normal_iterator<const_signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<const_signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>,_nullptr>
            (&local_90,_Var2,begin);
LAB_0033ddc0:
  std::__cxx11::
  basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>::operator=
            (&this_00->first,&local_90);
  std::__cxx11::
  basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>::
  ~basic_string(&local_90);
LAB_0033ddd0:
  std::
  pair<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
  ::pair(__return_storage_ptr__,&local_70);
  std::
  pair<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
  ::~pair(&local_70);
  return __return_storage_ptr__;
}

Assistant:

constexpr auto word_split_once(ItrT begin, EndT end, ElementT in_whitespace) {
	static_assert(sizeof...(OptionalMemberT) <= 1, "Too many member types specified for OptionalMemberT");
	using MemberT = std::tuple_element_t<0, std::tuple<OptionalMemberT..., std::basic_string<ElementT>>>;

	std::pair<MemberT, MemberT> result;
	if (begin >= end) {
		// Nothing to word_split
		return result;
	}

	while (begin != end
		&& *begin == in_whitespace) {
		++begin;
	}

	for (auto itr = begin; itr != end; ++itr) {
		if (*itr == in_whitespace) {
			// in_whitespace found; word_split upon it
			result.first = make_word_split_member<MemberT>(begin, itr);

			++itr;
			while (itr != end
				&& *itr == in_whitespace) {
				++itr;
			}

			result.second = make_word_split_member<MemberT>(itr, end);
			return result;
		}
	}

	// in_whitespace not found
	result.first = make_word_split_member<MemberT>(begin, end);
	return result;
}